

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
::
basic_methods_impl_mixin<unsigned_long&,std::function<void(std::__cxx11::string_const&)>&,std::function<void(std::exception_const&)>&>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
           *this,unsigned_long *args,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *args_1,function<void_(const_std::exception_&)> *args_2)

{
  size_t initial_heap_capacity;
  _Any_data local_60;
  _Manager_type local_50;
  _Any_data local_40;
  _Manager_type local_30;
  
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  std::condition_variable::condition_variable((condition_variable *)(this + 0x28));
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  initial_heap_capacity = *args;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_40,args_1);
  std::function<void_(const_std::exception_&)>::function
            ((function<void_(const_std::exception_&)> *)&local_60,args_2);
  timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::timer_heap_engine((timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                       *)(this + 0x68),initial_heap_capacity,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_40,(function<void_(const_std::exception_&)> *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

basic_methods_impl_mixin(
		ARGS && ... args )
		:	m_engine( std::forward< ARGS >(args)... )
	{
	}